

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::Cord::InlineRep::AppendTreeToTree
          (InlineRep *this,Nonnull<CordRep_*> tree,MethodIdentifier method)

{
  bool bVar1;
  CordzInfo *info;
  CordRep *rep;
  Nonnull<CordRepBtree_*> tree_00;
  CordRepBtree *rep_00;
  CordzUpdateScope local_28;
  CordzUpdateScope scope;
  MethodIdentifier method_local;
  Nonnull<CordRep_*> tree_local;
  InlineRep *this_local;
  
  scope.info_._4_4_ = method;
  bVar1 = is_tree(this);
  if (!bVar1) {
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0xda,
                  "void absl::Cord::InlineRep::AppendTreeToTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  info = cord_internal::InlineData::cordz_info(&this->data_);
  cord_internal::CordzUpdateScope::CordzUpdateScope(&local_28,info,scope.info_._4_4_);
  rep = cord_internal::InlineData::as_tree(&this->data_);
  tree_00 = ForceBtree(rep);
  rep_00 = cord_internal::CordRepBtree::Append(tree_00,tree);
  SetTree(this,&rep_00->super_CordRep,&local_28);
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_28);
  return;
}

Assistant:

void Cord::InlineRep::AppendTreeToTree(absl::Nonnull<CordRep*> tree,
                                       MethodIdentifier method) {
  assert(is_tree());
  const CordzUpdateScope scope(data_.cordz_info(), method);
  tree = CordRepBtree::Append(ForceBtree(data_.as_tree()), tree);
  SetTree(tree, scope);
}